

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNQIn.cpp
# Opt level: O1

void __thiscall NaPNQueueInput::action(NaPNQueueInput *this)

{
  int iVar1;
  uint uVar2;
  NaVector *pNVar3;
  undefined4 extraout_var;
  uint i;
  NaReal NVar4;
  
  uVar2 = this->nDataSize;
  if (uVar2 != 0) {
    i = 0;
    do {
      NVar4 = NaVector::operator()(&this->vQueue,i);
      pNVar3 = NaPetriCnOutput::data(&this->out);
      iVar1 = (*pNVar3->_vptr_NaVector[8])(pNVar3,(ulong)i);
      *(NaReal *)CONCAT44(extraout_var,iVar1) = NVar4;
      i = i + 1;
      uVar2 = this->nDataSize;
    } while (i < uVar2);
  }
  pNVar3 = &this->vQueue;
  NaVector::shift(pNVar3,-uVar2);
  uVar2 = NaVector::dim(pNVar3);
  NaVector::new_dim(pNVar3,uVar2 - this->nDataSize);
  return;
}

Assistant:

void
NaPNQueueInput::action ()
{
  unsigned	i;

  // Get data from the queue
  for(i = 0; i < nDataSize; ++i){
    out.data()[i] = vQueue(i);
  }

  // Remove data portion
  vQueue.shift(- (int)nDataSize);
  vQueue.new_dim(vQueue.dim() - nDataSize);
}